

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall glcts::BasicGLSLBuiltIn::Run(BasicGLSLBuiltIn *this)

{
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  uint *puVar4;
  GLuint *data;
  long error;
  int m_abuf;
  int m_cac;
  int m_csac;
  int m_fac;
  int m_vac;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  BasicGLSLBuiltIn *this_local;
  
  local_20 = 
  "\nlayout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout(std430) buffer Output {\n  mediump uint data;\n} g_out;\nuniform mediump int m_vac;\nuniform mediump int m_fac;\nuniform mediump int m_csac;\nuniform mediump int m_cac;\nuniform mediump int m_abuf;\nvoid main() {\n  mediump uint res = 1u;\n  if (gl_MaxVertexAtomicCounters < 0 || gl_MaxVertexAtomicCounters != m_vac)\n     res = res * 2u;\n  if (gl_MaxFragmentAtomicCounters < 0 || gl_MaxFragmentAtomicCounters != m_fac)\n     res = res * 3u;\n  if (gl_MaxComputeAtomicCounters < 8 || gl_MaxComputeAtomicCounters != m_csac)\n     res = res * 5u;\n  if (gl_MaxCombinedAtomicCounters < 8 || gl_MaxCombinedAtomicCounters != m_cac)\n     res = res * 7u;\n  if (gl_MaxAtomicCounterBindings < 1 || gl_MaxAtomicCounterBindings != m_abuf)\n     res = res * 11u;\n  g_out.data = res;\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout(std430) buffer Output {\n  mediump uint data;\n} g_out;\nuniform mediump int m_vac;\nuniform mediump int m_fac;\nuniform mediump int m_csac;\nuniform mediump int m_cac;\nuniform mediump int m_abuf;\nvoid main() {\n  mediump uint res = 1u;\n  if (gl_MaxVertexAtomicCounters < 0 || gl_MaxVertexAtomicCounters != m_vac)\n     res = res * 2u;\n  if (gl_MaxFragmentAtomicCounters < 0 || gl_MaxFragmentAtomicCounters != m_fac)\n     res = res * 3u;\n  if (gl_MaxComputeAtomicCounters < 8 || gl_MaxComputeAtomicCounters != m_csac)\n     res = res * 5u;\n  if (gl_MaxCombinedAtomicCounters < 8 || gl_MaxCombinedAtomicCounters != m_cac)\n     res = res * 7u;\n  if (gl_MaxAtomicCounterBindings < 1 || gl_MaxAtomicCounterBindings != m_abuf)\n     res = res * 11u;\n  g_out.data = res;\n}"
             ,&local_41);
  GVar2 = BasicUsageCS::CreateComputeProgram(&this->super_BasicUsageCS,&local_40);
  *(GLuint *)&(this->super_BasicUsageCS).field_0x34 = GVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,*(GLuint *)&(this->super_BasicUsageCS).field_0x34);
  bVar1 = BasicUsageCS::CheckProgram
                    (&this->super_BasicUsageCS,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,
                     (bool *)0x0);
  if (bVar1) {
    glu::CallLogWrapper::glUseProgram
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,*(GLuint *)&(this->super_BasicUsageCS).field_0x34);
    glu::CallLogWrapper::glGetIntegerv
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92d2,&m_csac);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.
                        super_GLWrapper.super_CallLogWrapper,
                       *(GLuint *)&(this->super_BasicUsageCS).field_0x34,"m_vac");
    glu::CallLogWrapper::glUniform1i
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GVar3,m_csac);
    glu::CallLogWrapper::glGetIntegerv
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92d6,&m_cac);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.
                        super_GLWrapper.super_CallLogWrapper,
                       *(GLuint *)&(this->super_BasicUsageCS).field_0x34,"m_fac");
    glu::CallLogWrapper::glUniform1i
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GVar3,m_cac);
    glu::CallLogWrapper::glGetIntegerv
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8265,&m_abuf);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.
                        super_GLWrapper.super_CallLogWrapper,
                       *(GLuint *)&(this->super_BasicUsageCS).field_0x34,"m_csac");
    glu::CallLogWrapper::glUniform1i
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GVar3,m_abuf);
    glu::CallLogWrapper::glGetIntegerv
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92d7,(GLint *)((long)&error + 4));
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.
                        super_GLWrapper.super_CallLogWrapper,
                       *(GLuint *)&(this->super_BasicUsageCS).field_0x34,"m_cac");
    glu::CallLogWrapper::glUniform1i
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GVar3,error._4_4_);
    glu::CallLogWrapper::glGetIntegerv
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92dc,(GLint *)&error);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.
                        super_GLWrapper.super_CallLogWrapper,
                       *(GLuint *)&(this->super_BasicUsageCS).field_0x34,"m_abuf");
    glu::CallLogWrapper::glUniform1i
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GVar3,(GLint)error);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_buffer);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,this->m_buffer);
    glu::CallLogWrapper::glBufferData
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,4,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0);
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,1,1);
    data = (GLuint *)0x0;
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_buffer);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x200);
    puVar4 = (uint *)glu::CallLogWrapper::glMapBufferRange
                               (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.
                                 super_GLWrapper.super_CallLogWrapper,0x90d2,0,4,1);
    if (*puVar4 != 1) {
      glcts::anon_unknown_0::Output("Expected 1, got: %d",(ulong)*puVar4);
      data = (GLuint *)&DAT_ffffffffffffffff;
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0);
    this_local = (BasicGLSLBuiltIn *)data;
  }
  else {
    this_local = (BasicGLSLBuiltIn *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		// create program
		const char* const glsl_cs = NL
			"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;" NL "layout(std430) buffer Output {" NL
			"  mediump uint data;" NL "} g_out;" NL "uniform mediump int m_vac;" NL "uniform mediump int m_fac;" NL
			"uniform mediump int m_csac;" NL "uniform mediump int m_cac;" NL "uniform mediump int m_abuf;" NL
			"void main() {" NL "  mediump uint res = 1u;" NL
			"  if (gl_MaxVertexAtomicCounters < 0 || gl_MaxVertexAtomicCounters != m_vac)" NL "     res = res * 2u;" NL
			"  if (gl_MaxFragmentAtomicCounters < 0 || gl_MaxFragmentAtomicCounters != m_fac)" NL
			"     res = res * 3u;" NL
			"  if (gl_MaxComputeAtomicCounters < 8 || gl_MaxComputeAtomicCounters != m_csac)" NL
			"     res = res * 5u;" NL
			"  if (gl_MaxCombinedAtomicCounters < 8 || gl_MaxCombinedAtomicCounters != m_cac)" NL
			"     res = res * 7u;" NL
			"  if (gl_MaxAtomicCounterBindings < 1 || gl_MaxAtomicCounterBindings != m_abuf)" NL
			"     res = res * 11u;" NL "  g_out.data = res;" NL "}";

		prog_ = CreateComputeProgram(glsl_cs);
		glLinkProgram(prog_);
		if (!CheckProgram(prog_))
			return ERROR;
		glUseProgram(prog_);

		int m_vac;
		int m_fac;
		int m_csac;
		int m_cac;
		int m_abuf;
		glGetIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTERS, &m_vac);
		glUniform1i(glGetUniformLocation(prog_, "m_vac"), m_vac);
		glGetIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTERS, &m_fac);
		glUniform1i(glGetUniformLocation(prog_, "m_fac"), m_fac);
		glGetIntegerv(GL_MAX_COMPUTE_ATOMIC_COUNTERS, &m_csac);
		glUniform1i(glGetUniformLocation(prog_, "m_csac"), m_csac);
		glGetIntegerv(GL_MAX_COMBINED_ATOMIC_COUNTERS, &m_cac);
		glUniform1i(glGetUniformLocation(prog_, "m_cac"), m_cac);
		glGetIntegerv(GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS, &m_abuf);
		glUniform1i(glGetUniformLocation(prog_, "m_abuf"), m_abuf);

		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint), NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glDispatchCompute(1, 1, 1);

		long	error = NO_ERROR;
		GLuint* data;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		data = static_cast<GLuint*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint), GL_MAP_READ_BIT));
		if (data[0] != 1u)
		{
			Output("Expected 1, got: %d", data[0]);
			error = ERROR;
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		return error;
	}